

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

void __thiscall
immutable::ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_>::~ref
          (ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *this)

{
  ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *this_local;
  
  rrb_details::release<immutable::vector<char,false,5>>(this->ptr);
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }